

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_ssse3_intr.c
# Opt level: O0

void ihevc_intra_pred_luma_ref_substitution_ssse3
               (UWORD8 *pu1_top_left,UWORD8 *pu1_top,UWORD8 *pu1_left,WORD32 src_strd,WORD32 nt,
               WORD32 nbr_flags,UWORD8 *pu1_dst,WORD32 dst_strd)

{
  undefined1 uVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  undefined1 *in_RDI;
  int in_R8D;
  uint in_R9D;
  long in_stack_00000008;
  WORD32 nbr_flags_temp;
  WORD32 a_nbr_flag [5];
  WORD32 frwd_nbr_flag;
  WORD32 nbr_id_from_bl;
  WORD32 idx;
  WORD32 tp_left;
  WORD32 tp_right;
  WORD32 top;
  WORD32 left;
  WORD32 bot_left;
  WORD32 next;
  WORD32 get_bits;
  WORD32 three_nt;
  WORD32 two_nt;
  WORD32 total_samples;
  WORD32 i;
  WORD32 dc_val;
  UWORD8 pu1_ref;
  UWORD32 local_94;
  UWORD32 local_90;
  bool local_86;
  UWORD32 local_84;
  UWORD32 local_80;
  int local_78 [5];
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  uint local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  undefined4 local_2c;
  undefined1 local_25;
  uint local_24;
  int local_20;
  
  local_34 = in_R8D * 4 + 1;
  local_38 = in_R8D * 2;
  local_3c = in_R8D * 3;
  local_2c = 0x80;
  if (in_R9D == 0) {
    for (local_30 = 0; local_30 < local_34; local_30 = local_30 + 1) {
      *(undefined1 *)(in_stack_00000008 + local_30) = 0x80;
    }
  }
  else {
    *(undefined1 *)(in_stack_00000008 + local_38) = *in_RDI;
    for (local_30 = 0; local_30 < local_38; local_30 = local_30 + 1) {
      *(undefined1 *)(in_stack_00000008 + ((local_38 + -1) - local_30)) =
           *(undefined1 *)(in_RDX + local_30 * in_ECX);
    }
    for (local_30 = 0; local_30 < local_38; local_30 = local_30 + 1) {
      *(undefined1 *)(in_stack_00000008 + (local_38 + 1 + local_30)) =
           *(undefined1 *)(in_RSI + local_30);
    }
    if (in_R8D < 9) {
      local_58 = (int)(in_R9D & 0x10000) >> 0x10;
      local_48 = (int)(in_R9D & 8) >> 3;
      local_4c = (int)(in_R9D & 0x80) >> 7;
      local_50 = (int)(in_R9D & 0x100) >> 8;
      local_54 = (int)(in_R9D & 0x1000) >> 0xc;
      local_44 = 1;
      if (local_48 == 0) {
        local_78[1] = local_4c;
        local_78[2] = local_58;
        local_78[3] = local_50;
        local_78[4] = local_54;
        for (; local_78[local_44] == 0; local_44 = local_44 + 1) {
        }
        if (local_44 < 3) {
          local_5c = in_R8D * local_44;
          local_25 = *(undefined1 *)(in_stack_00000008 + local_5c);
          for (local_30 = 0; local_30 < local_5c; local_30 = local_30 + 1) {
            *(undefined1 *)(in_stack_00000008 + local_30) = local_25;
          }
        }
        else {
          local_5c = in_R8D * (local_44 + -1) + 1;
          local_25 = *(undefined1 *)(in_stack_00000008 + local_5c);
          for (local_30 = 0; local_30 < local_5c; local_30 = local_30 + 1) {
            *(undefined1 *)(in_stack_00000008 + local_30) = local_25;
          }
        }
        local_78[0] = 0;
      }
      if (local_4c == 0) {
        for (local_30 = 0; local_30 < in_R8D; local_30 = local_30 + 1) {
          *(undefined1 *)(in_stack_00000008 + (in_R8D + local_30)) =
               *(undefined1 *)(in_stack_00000008 + (in_R8D + -1));
        }
      }
      if (local_58 == 0) {
        *(undefined1 *)(in_stack_00000008 + local_38) =
             *(undefined1 *)(in_stack_00000008 + (local_38 + -1));
      }
      if (local_50 == 0) {
        for (local_30 = 0; local_30 < in_R8D; local_30 = local_30 + 1) {
          *(undefined1 *)(in_stack_00000008 + (local_38 + 1 + local_30)) =
               *(undefined1 *)(in_stack_00000008 + local_38);
        }
      }
      if (local_54 == 0) {
        for (local_30 = 0; local_30 < in_R8D; local_30 = local_30 + 1) {
          *(undefined1 *)(in_stack_00000008 + (local_3c + 1 + local_30)) =
               *(undefined1 *)(in_stack_00000008 + local_3c);
        }
      }
    }
    local_24 = in_R9D;
    local_20 = in_R8D;
    if (in_R8D == 0x10) {
      uVar2 = ((int)(in_R9D & 0xc) >> 2) + ((int)(in_R9D & 0xc0) >> 4) +
              ((int)(in_R9D & 0x300) >> 4) + ((int)(in_R9D & 0x3000) >> 6) +
              ((int)(in_R9D & 0x10000) >> 8);
      if ((uVar2 & 0xf) == 0) {
        local_80 = 8;
      }
      else {
        local_80 = CTZ(uVar2 & 0xf);
      }
      local_60 = local_80 << 3;
      if (local_60 == 0x40) {
        local_60 = 0x20;
      }
      if ((local_60 == 0x20) && (((int)uVar2 >> 8 & 1U) == 0)) {
        local_60 = 0x21;
        if (((int)uVar2 >> 4 & 0xfU) == 0) {
          local_84 = 8;
        }
        else {
          local_84 = CTZ((int)uVar2 >> 4 & 0xf);
        }
        local_60 = local_84 * 8 + local_60;
      }
      if (local_60 != 0) {
        local_25 = *(undefined1 *)(in_stack_00000008 + local_60);
        local_30 = local_60;
        while (local_30 = local_30 + -1, -1 < local_30) {
          *(undefined1 *)(in_stack_00000008 + local_30) = local_25;
        }
      }
      for (; local_60 < 0x41; local_60 = iVar3 + local_60) {
        local_64 = local_60 >> 3;
        if (local_60 == 0x20) {
          local_40 = (uint)((uVar2 & 0x100) != 0);
          if (local_40 == 0) {
            *(undefined1 *)(in_stack_00000008 + 0x20) = *(undefined1 *)(in_stack_00000008 + 0x1f);
          }
        }
        else {
          local_86 = (uVar2 & 1 << ((byte)local_64 & 0x1f)) != 0 &&
                     1 << ((byte)local_64 & 0x1f) != 0;
          local_40 = (uint)local_86;
          if (local_40 == 0) {
            local_25 = *(undefined1 *)(in_stack_00000008 + (local_60 + -1));
            for (local_30 = 0; local_30 < 8; local_30 = local_30 + 1) {
              *(undefined1 *)(in_stack_00000008 + (local_60 + local_30)) = local_25;
            }
          }
        }
        iVar3 = 8;
        if (local_60 == 0x20) {
          iVar3 = 1;
        }
      }
    }
    if (local_20 == 0x20) {
      if ((local_24 & 0xff) == 0) {
        local_90 = 8;
      }
      else {
        local_90 = CTZ(local_24 & 0xff);
      }
      local_60 = local_90 * 8;
      if ((local_60 == 0x40) && (((int)local_24 >> 0x10 & 1U) == 0)) {
        local_60 = 0x41;
        if (((int)local_24 >> 8 & 0xffU) == 0) {
          local_94 = 8;
        }
        else {
          local_94 = CTZ((int)local_24 >> 8 & 0xff);
        }
        local_60 = local_94 * 8 + local_60;
      }
      if (local_60 != 0) {
        uVar1 = *(undefined1 *)(in_stack_00000008 + local_60);
        local_30 = local_60;
        while (local_30 = local_30 + -1, -1 < local_30) {
          *(undefined1 *)(in_stack_00000008 + local_30) = uVar1;
        }
      }
      for (; local_60 < 0x81; local_60 = iVar3 + local_60) {
        if (local_60 == 0x40) {
          if ((local_24 & 0x10000) == 0) {
            *(undefined1 *)(in_stack_00000008 + 0x40) = *(undefined1 *)(in_stack_00000008 + 0x3f);
          }
        }
        else {
          bVar4 = (byte)(local_60 >> 3);
          if ((local_24 & 1 << (bVar4 & 0x1f)) == 0 || 1 << (bVar4 & 0x1f) == 0) {
            uVar1 = *(undefined1 *)(in_stack_00000008 + (local_60 + -1));
            for (local_30 = 0; local_30 < 8; local_30 = local_30 + 1) {
              *(undefined1 *)(in_stack_00000008 + (local_60 + local_30)) = uVar1;
            }
          }
        }
        iVar3 = 8;
        if (local_60 == 0x40) {
          iVar3 = 1;
        }
      }
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_ref_substitution_ssse3(UWORD8 *pu1_top_left,
                                                  UWORD8 *pu1_top,
                                                  UWORD8 *pu1_left,
                                                  WORD32 src_strd,
                                                  WORD32 nt,
                                                  WORD32 nbr_flags,
                                                  UWORD8 *pu1_dst,
                                                  WORD32 dst_strd)
{
    UWORD8 pu1_ref;
    WORD32 dc_val, i;
    WORD32 total_samples = (4 * nt) + 1;
    WORD32 two_nt = 2 * nt;

    WORD32 three_nt = 3 * nt;
    WORD32 get_bits;
    WORD32 next;
    WORD32 bot_left, left, top, tp_right, tp_left;

    WORD32 idx, nbr_id_from_bl, frwd_nbr_flag;
    UNUSED(dst_strd);

    dc_val = 1 << (BIT_DEPTH - 1);


    /* Neighbor Flag Structure*/
    /* MSB ---> LSB */
    /*    Top-Left | Top-Right | Top | Left | Bottom-Left
              1         4         4     4         4
     */
    /* If no neighbor flags are present, fill the neighbor samples with DC value */
    if(nbr_flags == 0)
    {
        for(i = 0; i < total_samples; i++)
        {
            pu1_dst[i] = dc_val;
        }
    }
    else
    {
        /* Else fill the corresponding samples */
        pu1_dst[two_nt] = *pu1_top_left;
        for(i = 0; i < two_nt; i++)
            pu1_dst[two_nt - 1 - i] = pu1_left[i * src_strd];
        for(i = 0; i < two_nt; i++)
            pu1_dst[two_nt + 1 + i] = pu1_top[i];

        if(nt <= 8)
        {
            /* 1 bit extraction for all the neighboring blocks */
            tp_left = (nbr_flags & 0x10000) >> 16;
            bot_left = (nbr_flags & 0x8) >> 3;
            left = (nbr_flags & 0x80) >> 7;
            top = (nbr_flags & 0x100) >> 8;
            tp_right = (nbr_flags & 0x1000) >> 12;

            next = 1;

            /* If bottom -left is not available, reverse substitution process*/
            if(bot_left == 0)
            {
                WORD32 a_nbr_flag[5] = { bot_left, left, tp_left, top, tp_right };

                /* Check for the 1st available sample from bottom-left*/
                while(!a_nbr_flag[next])
                    next++;

                /* If Left, top-left are available*/
                if(next <= 2)
                {
                    idx = nt * next;
                    pu1_ref = pu1_dst[idx];
                    for(i = 0; i < idx; i++)
                        pu1_dst[i] = pu1_ref;
                }
                else /* If top, top-right are available */
                {
                    /* Idx is changed to copy 1 pixel value for top-left ,if top-left is not available*/
                    idx = (nt * (next - 1)) + 1;
                    pu1_ref = pu1_dst[idx];
                    for(i = 0; i < idx; i++)
                        pu1_dst[i] = pu1_ref;
                }
            }

            /* Forward Substitution Process */
            /* If left is Unavailable, copy the last bottom-left value */
            if(left == 0)
            {
                for(i = 0; i < nt; i++)
                    pu1_dst[nt + i] = pu1_dst[nt - 1];
            }
            /* If top-left is Unavailable, copy the last left value */
            if(tp_left == 0)
                pu1_dst[two_nt] = pu1_dst[two_nt - 1];
            /* If top is Unavailable, copy the last top-left value */
            if(top == 0)
            {
                for(i = 0; i < nt; i++)
                    pu1_dst[two_nt + 1 + i] = pu1_dst[two_nt];
            }
            /* If to right is Unavailable, copy the last top value */
            if(tp_right == 0)
            {
                for(i = 0; i < nt; i++)
                    pu1_dst[three_nt + 1 + i] = pu1_dst[three_nt];
            }
        }

        if(nt == 16)
        {
            WORD32 nbr_flags_temp = 0;
            nbr_flags_temp = ((nbr_flags & 0xC) >> 2) + ((nbr_flags & 0xC0) >> 4)
                            + ((nbr_flags & 0x300) >> 4)
                            + ((nbr_flags & 0x3000) >> 6)
                            + ((nbr_flags & 0x10000) >> 8);

            /* compute trailing zeors based on nbr_flag for substitution process of below left see section .*/
            /* as each bit in nbr flags corresponds to 8 pels for bot_left, left, top and topright but 1 pel for topleft */
            {
                nbr_id_from_bl = look_up_trailing_zeros(nbr_flags_temp & 0XF) * 8; /* for below left and left */

                if(nbr_id_from_bl == 64)
                    nbr_id_from_bl = 32;

                if(nbr_id_from_bl == 32)
                {
                    /* for top left : 1 pel per nbr bit */
                    if(!((nbr_flags_temp >> 8) & 0x1))
                    {
                        nbr_id_from_bl++;
                        nbr_id_from_bl += look_up_trailing_zeros((nbr_flags_temp >> 4) & 0xF) * 8; /* top and top right;  8 pels per nbr bit */
                        //nbr_id_from_bl += idx * 8;
                    }
                }
                /* Reverse Substitution Process*/
                if(nbr_id_from_bl)
                {
                    /* Replicate the bottom-left and subsequent unavailable pixels with the 1st available pixel above */
                    pu1_ref = pu1_dst[nbr_id_from_bl];
                    for(i = (nbr_id_from_bl - 1); i >= 0; i--)
                    {
                        pu1_dst[i] = pu1_ref;
                    }
                }
            }

            /* for the loop of 4*Nt+1 pixels (excluding pixels computed from reverse substitution) */
            while(nbr_id_from_bl < ((T16_4NT) + 1))
            {
                /* To Obtain the next unavailable idx flag after reverse neighbor substitution  */
                /* Devide by 8 to obtain the original index */
                frwd_nbr_flag = (nbr_id_from_bl >> 3); /*+ (nbr_id_from_bl & 0x1);*/

                /* The Top-left flag is at the last bit location of nbr_flags*/
                if(nbr_id_from_bl == (T16_4NT / 2))
                {
                    get_bits = GET_BITS(nbr_flags_temp, 8);

                    /* only pel substitution for TL */
                    if(!get_bits)
                        pu1_dst[nbr_id_from_bl] = pu1_dst[nbr_id_from_bl - 1];
                }
                else
                {
                    get_bits = GET_BITS(nbr_flags_temp, frwd_nbr_flag);
                    if(!get_bits)
                    {
                        /* 8 pel substitution (other than TL) */
                        pu1_ref = pu1_dst[nbr_id_from_bl - 1];
                        for(i = 0; i < 8; i++)
                            pu1_dst[nbr_id_from_bl + i] = pu1_ref;
                    }

                }
                nbr_id_from_bl += (nbr_id_from_bl == (T16_4NT / 2)) ? 1 : 8;
            }


        }

        if(nt == 32)
        {
            /* compute trailing ones based on mbr_flag for substitution process of below left see section .*/
            /* as each bit in nbr flags corresponds to 8 pels for bot_left, left, top and topright but 1 pel for topleft */
            {
                nbr_id_from_bl = look_up_trailing_zeros((nbr_flags & 0XFF)) * 8; /* for below left and left */

                if(nbr_id_from_bl == 64)
                {
                    /* for top left : 1 pel per nbr bit */
                    if(!((nbr_flags >> 16) & 0x1))
                    {
                        /* top left not available */
                        nbr_id_from_bl++;
                        /* top and top right;  8 pels per nbr bit */
                        nbr_id_from_bl += look_up_trailing_zeros((nbr_flags >> 8) & 0xFF) * 8;
                    }
                }
                /* Reverse Substitution Process*/
                if(nbr_id_from_bl)
                {
                    /* Replicate the bottom-left and subsequent unavailable pixels with the 1st available pixel above */
                    pu1_ref = pu1_dst[nbr_id_from_bl];
                    for(i = (nbr_id_from_bl - 1); i >= 0; i--)
                        pu1_dst[i] = pu1_ref;
                }
            }

            /* for the loop of 4*Nt+1 pixels (excluding pixels computed from reverse substitution) */
            while(nbr_id_from_bl < ((T32_4NT) + 1))
            {
                /* To Obtain the next unavailable idx flag after reverse neighbor substitution  */
                /* Devide by 8 to obtain the original index */
                frwd_nbr_flag = (nbr_id_from_bl >> 3); /*+ (nbr_id_from_bl & 0x1);*/

                /* The Top-left flag is at the last bit location of nbr_flags*/
                if(nbr_id_from_bl == (T32_4NT / 2))
                {
                    get_bits = GET_BITS(nbr_flags, 16);
                    /* only pel substitution for TL */
                    if(!get_bits)
                        pu1_dst[nbr_id_from_bl] = pu1_dst[nbr_id_from_bl - 1];
                }
                else
                {
                    get_bits = GET_BITS(nbr_flags, frwd_nbr_flag);
                    if(!get_bits)
                    {
                        /* 8 pel substitution (other than TL) */
                        pu1_ref = pu1_dst[nbr_id_from_bl - 1];
                        for(i = 0; i < 8; i++)
                            pu1_dst[nbr_id_from_bl + i] = pu1_ref;
                    }

                }
                nbr_id_from_bl += (nbr_id_from_bl == (T32_4NT / 2)) ? 1 : 8;
            }
        }

    }
}